

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall diy::Link::fix(Link *this,Assigner *assigner)

{
  int iVar1;
  uint uVar2;
  pointer pBVar3;
  ulong uVar4;
  
  pBVar3 = (this->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar2 = 0; uVar4 = (ulong)uVar2,
      uVar4 < (ulong)((long)(this->neighbors_).
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pBVar3 >> 3);
      uVar2 = uVar2 + 1) {
    iVar1 = (*assigner->_vptr_Assigner[3])(assigner,(ulong)(uint)pBVar3[uVar4].gid);
    pBVar3 = (this->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar3[uVar4].proc = iVar1;
  }
  return;
}

Assistant:

void      fix(const Assigner& assigner)       { for (unsigned i = 0; i < neighbors_.size(); ++i) { neighbors_[i].proc = assigner.rank(neighbors_[i].gid); } }